

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::CollectMemcopyLdElementI(GlobOpt *this,Instr *instr,Loop *loop)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  IndirOpnd *pIVar5;
  GlobOpt *baseOpnd;
  StackSym *pSVar6;
  RegOpnd *pRVar7;
  MemOpCandidate *pMVar8;
  GlobOpt *this_01;
  GlobOpt *this_02;
  MemOpCandidate *local_48;
  GlobOpt *local_40;
  SymID local_38;
  SymID local_34 [2];
  SymID inductionSymID;
  
  local_40 = this;
  bVar2 = IR::Opnd::IsIndirOpnd(instr->m_src1);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x7ae,"(instr->GetSrc1()->IsIndirOpnd())","instr->GetSrc1()->IsIndirOpnd()")
    ;
    if (!bVar2) goto LAB_00422b7c;
    *puVar4 = 0;
  }
  pIVar5 = IR::Opnd::AsIndirOpnd(instr->m_src1);
  this_02 = (GlobOpt *)pIVar5->m_indexOpnd;
  baseOpnd = (GlobOpt *)IR::Opnd::AsRegOpnd(&pIVar5->m_baseOpnd->super_Opnd);
  this_01 = baseOpnd;
  pSVar6 = IR::Opnd::GetStackSym((Opnd *)baseOpnd);
  local_38 = GetVarSymID(this_01,pSVar6);
  bVar3 = IsAllowedForMemOpt(local_40,instr,false,(RegOpnd *)baseOpnd,(Opnd *)this_02);
  bVar2 = false;
  if (bVar3) {
    pSVar6 = IR::Opnd::GetStackSym((Opnd *)this_02);
    local_34[0] = GetVarSymID(this_02,pSVar6);
    bVar2 = IsSymIDInductionVariable(this_02,local_34[0],loop);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x7bb,"(IsSymIDInductionVariable(inductionSymID, loop))",
                         "IsSymIDInductionVariable(inductionSymID, loop)");
      if (!bVar2) {
LAB_00422b7c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    Loop::EnsureMemOpVariablesInitialized(loop);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(loop->memOpInfo->inductionVariableChangeInfoMap,local_34);
    this_00 = instr->m_dst;
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (bVar2) {
      pRVar7 = IR::Opnd::AsRegOpnd(this_00);
      pSVar6 = IR::Opnd::GetStackSym(&pRVar7->super_Opnd);
      bVar2 = false;
      if (((pSVar6->field_0x18 & 1) != 0) &&
         (bVar2 = false, (pSVar6->field_5).m_instrDef != (Instr *)0x0)) {
        pMVar8 = (MemOpCandidate *)
                 new<Memory::JitArenaAllocator>(0x28,local_40->func->topFunc->m_fg->alloc,0x3d6ef4);
        pMVar8->type = MEMCOPY;
        pMVar8[1].base = local_38;
        *(undefined1 *)&pMVar8[2].base = 1;
        pMVar8->count = '\0';
        pMVar8->bIndexAlreadyChanged = bVar3;
        pMVar8->base = 0xffffffff;
        pMVar8->index = local_34[0];
        pRVar7 = IR::Opnd::AsRegOpnd(this_00);
        pSVar6 = IR::Opnd::GetStackSym(&pRVar7->super_Opnd);
        *(StackSym **)&pMVar8[1].count = pSVar6;
        local_48 = pMVar8;
        SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (&loop->memOpInfo->candidates->
                    super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>,&local_48
                  );
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool
GlobOpt::CollectMemcopyLdElementI(IR::Instr *instr, Loop *loop)
{
    Assert(instr->GetSrc1()->IsIndirOpnd());

    IR::IndirOpnd *src1 = instr->GetSrc1()->AsIndirOpnd();
    IR::Opnd *indexOpnd = src1->GetIndexOpnd();
    IR::RegOpnd *baseOpnd = src1->GetBaseOpnd()->AsRegOpnd();
    SymID baseSymID = GetVarSymID(baseOpnd->GetStackSym());

    if (!IsAllowedForMemOpt(instr, false, baseOpnd, indexOpnd))
    {
        return false;
    }

    SymID inductionSymID = GetVarSymID(indexOpnd->GetStackSym());
    Assert(IsSymIDInductionVariable(inductionSymID, loop));

    loop->EnsureMemOpVariablesInitialized();
    bool isIndexPreIncr = loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID);

    IR::Opnd * dst = instr->GetDst();
    if (!dst->IsRegOpnd() || !dst->AsRegOpnd()->GetStackSym()->IsSingleDef())
    {
        return false;
    }

    Loop::MemCopyCandidate* memcopyInfo = memcopyInfo = JitAnewStruct(this->func->GetTopFunc()->m_fg->alloc, Loop::MemCopyCandidate);
    memcopyInfo->ldBase = baseSymID;
    memcopyInfo->ldCount = 1;
    memcopyInfo->count = 0;
    memcopyInfo->bIndexAlreadyChanged = isIndexPreIncr;
    memcopyInfo->base = Js::Constants::InvalidSymID; //need to find the stElem first
    memcopyInfo->index = inductionSymID;
    memcopyInfo->transferSym = dst->AsRegOpnd()->GetStackSym();
    loop->memOpInfo->candidates->Prepend(memcopyInfo);
    return true;
}